

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

void __thiscall doublechecked::Roaring::flip(Roaring *this,uint64_t range_start,uint64_t range_end)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  uint in_EAX;
  iterator __position;
  uint64_t i;
  ulong uVar1;
  uint local_38;
  key_type local_34;
  
  local_38 = in_EAX;
  roaring::Roaring::flip(&this->plain,range_start,range_end);
  if (range_start < range_end) {
    uVar1 = 0x100000000;
    if (range_end < 0x100000000) {
      uVar1 = range_end;
    }
    this_00 = &this->check;
    _local_38 = CONCAT44((int)range_start,local_38);
    __position = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::lower_bound(&this_00->_M_t,&local_34);
    for (; range_start < uVar1; range_start = range_start + 1) {
      if (((_Rb_tree_header *)__position._M_node ==
           &(this->check)._M_t._M_impl.super__Rb_tree_header) ||
         (range_start < __position._M_node[1]._M_color)) {
        _local_38 = CONCAT44(local_34,(int)range_start);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique_<unsigned_int>
                  (&this_00->_M_t,(const_iterator)__position._M_node,&local_38);
      }
      else {
        __position = std::
                     _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                         *)this_00,__position._M_node);
      }
    }
  }
  return;
}

Assistant:

void flip(uint64_t range_start, uint64_t range_end) {
        plain.flip(range_start, range_end);

        if (range_start < range_end) {
            if (range_end >= UINT64_C(0x100000000))
                range_end = UINT64_C(0x100000000);
            auto hint = check.lower_bound(range_start);  // *hint stays as >= i
            auto it_end = check.end();
            for (uint64_t i = range_start; i < range_end; ++i) {
                if (hint == it_end || *hint > i)  // i not present, so add
                    check.insert(hint, i);        // leave hint past i
                else  // *hint == i, must adjust hint and erase
                    hint = check.erase(hint);  // returns *following* iterator
            }
        }
    }